

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O3

TransformPtr __thiscall Rml::Style::ComputedValues::transform(ComputedValues *this)

{
  Property *pPVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long *in_RSI;
  shared_ptr<Rml::Transform> sVar3;
  TransformPtr TVar4;
  
  pPVar1 = ElementStyle::GetLocalProperty
                     ((ElementStyle *)(*(long *)(*in_RSI + 0x180) + 0x38),Transform);
  if (pPVar1 == (Property *)0x0) {
    this->element = (Element *)0x0;
    *(undefined8 *)&this->common = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = Property::Get<std::shared_ptr<Rml::Transform>>((Property *)this);
    _Var2 = sVar3.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  TVar4.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  TVar4.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (TransformPtr)TVar4.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransformPtr      transform()                  const { return GetLocalProperty(PropertyId::Transform, TransformPtr()); }